

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

int set_field_buffer(FIELD *field,int buffer,char *value)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  char *pcVar7;
  int *piVar8;
  char cVar9;
  uint uVar10;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  uint uVar15;
  bool bVar16;
  
  iVar4 = -2;
  if ((((-1 < buffer) && (field != (FIELD *)0x0)) && (value != (char *)0x0)) &&
     (buffer <= field->nbuf)) {
    uVar15 = field->dcols * field->drows;
    if ((buffer == 0) && (bVar14 = *value, uVar15 != 0 && bVar14 != 0)) {
      ppuVar6 = __ctype_b_loc();
      lVar11 = 1;
      do {
        if ((*(byte *)((long)*ppuVar6 + (ulong)bVar14 * 2 + 1) & 0x40) == 0) goto LAB_004d0d97;
        bVar14 = value[lVar11];
      } while ((bVar14 != 0) && (uVar10 = (uint)lVar11, lVar11 = lVar11 + 1, uVar10 < uVar15));
    }
    if ((field->status & 8) != 0) {
      sVar5 = strlen(value);
      iVar4 = -2;
      bVar16 = true;
      uVar10 = (uint)sVar5;
      if (uVar15 <= uVar10 && uVar10 - uVar15 != 0) {
        _Var2 = Field_Grown(field,(uVar10 - uVar15) /
                                  (uint)((int)field->cols * ((int)field->rows + field->nrow)) + 1);
        iVar4 = -1;
        if (_Var2) {
          if (uVar15 < uVar10 && buffer == 0) {
            ppuVar6 = __ctype_b_loc();
            lVar11 = 0;
            do {
              if ((*(byte *)((long)*ppuVar6 + (long)value[lVar11 + (ulong)uVar15] * 2 + 1) & 0x40)
                  == 0) {
                iVar4 = -2;
                goto LAB_004d0cca;
              }
              lVar11 = lVar11 + 1;
            } while (uVar10 - uVar15 != (int)lVar11);
          }
          iVar4 = -2;
          bVar16 = true;
          uVar15 = uVar10;
        }
        else {
LAB_004d0cca:
          piVar8 = __errno_location();
          *piVar8 = iVar4;
          bVar16 = false;
        }
      }
      if (!bVar16) {
        return iVar4;
      }
    }
    pcVar7 = field->buf + (field->dcols * field->drows + 1) * buffer;
    cVar9 = *value;
    bVar16 = uVar15 != 0;
    pcVar12 = value;
    if ((cVar9 != '\0') && (uVar15 != 0)) {
      pcVar13 = pcVar7;
      pcVar1 = value + 1;
      do {
        pcVar12 = pcVar1;
        *pcVar13 = cVar9;
        cVar9 = *pcVar12;
        bVar16 = pcVar12 < value + uVar15;
        if (cVar9 == '\0') break;
        pcVar13 = pcVar13 + 1;
        pcVar1 = pcVar12 + 1;
      } while (pcVar12 < value + uVar15);
    }
    if (bVar16) {
      pcVar7[(int)((long)pcVar12 - (long)value)] = cVar9;
      pcVar12 = pcVar7 + ((long)pcVar12 - (long)value) + 1;
    }
    else {
      pcVar12 = (char *)0x0;
    }
    if (pcVar12 != (char *)0x0) {
      uVar10 = (int)(pcVar12 + -1) - (int)pcVar7;
      if (uVar15 < uVar10) {
        __assert_fail("len >= (unsigned int)(s-p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                      ,0xf09,"int set_field_buffer(FIELD *, int, const char *)");
      }
      if (uVar15 >= uVar10 && uVar15 - uVar10 != 0) {
        memset(pcVar12 + -1,0x20,(ulong)(uVar15 - uVar10));
      }
    }
    iVar4 = 0;
    if (buffer == 0) {
      iVar3 = Synchronize_Field(field);
      iVar4 = Synchronize_Linked_Fields(field);
      if (iVar4 == 0) {
        iVar4 = iVar3;
      }
      if (iVar3 != 0) {
        iVar4 = iVar3;
      }
    }
  }
LAB_004d0d97:
  piVar8 = __errno_location();
  *piVar8 = iVar4;
  return iVar4;
}

Assistant:

int set_field_buffer(FIELD * field, int buffer, const char * value)
{
  char *s, *p;
  int res = E_OK;
  unsigned int len;

  if ( !field || !value || ((buffer < 0)||(buffer > field->nbuf)) )
    RETURN(E_BAD_ARGUMENT);

  len  = Buffer_Length(field);

  if (buffer==0)
    {
      const char *v;
      unsigned int i = 0;

      for(v=value; *v && (i<len); v++,i++)
        {
          if (!isprint((unsigned char)*v))
            RETURN(E_BAD_ARGUMENT);
        }
    }

  if (Growable(field))
    {
      /* for a growable field we must assume zero terminated strings, because
         somehow we have to detect the length of what should be copied.
      */
      unsigned int vlen = strlen(value);
      if (vlen > len)
        {
          if (!Field_Grown(field,
                           (int)(1 + (vlen-len)/((field->rows+field->nrow)*field->cols))))
            RETURN(E_SYSTEM_ERROR);

          /* in this case we also have to check, whether or not the remaining
             characters in value are also printable for buffer 0. */
          if (buffer==0)
            {
              unsigned int i;
          
              for(i=len; i<vlen; i++)
                if (!isprint((int)(value[i])))
                  RETURN(E_BAD_ARGUMENT);
            }
          len = vlen;
        }
    }
  
  p   = Address_Of_Nth_Buffer(field,buffer);

#if HAVE_MEMCCPY
  s = memccpy(p,value,0,len);
#else
  for(s=(char *)value; *s && (s < (value+len)); s++)
    p[s-value] = *s;
  if (s < (value+len))
    {
      int off = s-value;
      p[off] = *s++;
      s = p + (s-value);
    }
  else 
    s=(char *)0;
#endif

  if (s) 
    { /* this means, value was null terminated and not greater than the
         buffer. We have to pad with blanks. Please note that due to memccpy
         logic s points after the terminating null. */
      s--; /* now we point to the terminator. */
      assert(len >= (unsigned int)(s-p));
      if (len > (unsigned int)(s-p))
        memset(s,C_BLANK,len-(unsigned int)(s-p));
    }

  if (buffer==0)
    {
      int syncres;
      if (((syncres=Synchronize_Field( field ))!=E_OK) && 
          (res==E_OK))
        res = syncres;
      if (((syncres=Synchronize_Linked_Fields(field ))!=E_OK) &&
          (res==E_OK))
        res = syncres;
    }
  RETURN(res);
}